

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InterpreterStackFrame.cpp
# Opt level: O3

int __thiscall Js::InterpreterStackFrame::OP_GrowMemory(InterpreterStackFrame *this,int32 delta)

{
  int32 iVar1;
  WebAssemblyMemory *this_00;
  
  this_00 = GetWebAssemblyMemory(this);
  iVar1 = WebAssemblyMemory::GrowInternal(this_00,delta);
  return iVar1;
}

Assistant:

int InterpreterStackFrame::OP_GrowMemory(int32 delta)
    {
#ifdef ENABLE_WASM
        return GetWebAssemblyMemory()->GrowInternal((uint32)delta);
#else
        Assert(UNREACHED);
        return 0;
#endif
    }